

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O0

void * plot_new(t_symbol *classsym,int argc,t_atom *argv)

{
  int iVar1;
  t_pd *object;
  _glist *p_Var2;
  t_symbol *ptVar3;
  t_symbol *firstarg;
  int defstyle;
  t_plot *x;
  t_atom *argv_local;
  int argc_local;
  t_symbol *classsym_local;
  
  object = pd_new(plot_class);
  firstarg._4_4_ = 1;
  p_Var2 = canvas_getcurrent();
  object[6] = (t_pd)p_Var2;
  ptVar3 = gensym("x");
  fielddesc_setfloat_var((_fielddesc *)(object + 0x2a),ptVar3);
  ptVar3 = gensym("y");
  fielddesc_setfloat_var((_fielddesc *)(object + 0x2f),ptVar3);
  ptVar3 = gensym("w");
  fielddesc_setfloat_var((_fielddesc *)(object + 0x34),ptVar3);
  fielddesc_setfloat_const((_fielddesc *)(object + 0x39),1.0);
  fielddesc_setfloat_const((_fielddesc *)(object + 0x3e),1.0);
  fielddesc_setfloat_const((_fielddesc *)(object + 0x43),1.0);
  x = (t_plot *)argv;
  argv_local._4_4_ = argc;
  while( true ) {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  ptVar3 = atom_getsymbolarg(0,argv_local._4_4_,(t_atom *)x);
                  iVar1 = strcmp(ptVar3->s_name,"curve");
                  if ((iVar1 != 0) && (iVar1 = strcmp(ptVar3->s_name,"-c"), iVar1 != 0)) break;
                  firstarg._4_4_ = 2;
                  argv_local._4_4_ = argv_local._4_4_ + -1;
                  x = (t_plot *)&(x->x_obj).te_binbuf;
                }
                iVar1 = strcmp(ptVar3->s_name,"-v");
                if ((iVar1 != 0) || (argv_local._4_4_ < 2)) break;
                fielddesc_setfloatarg
                          ((_fielddesc *)(object + 0x39),1,(t_atom *)&(x->x_obj).te_binbuf);
                argv_local._4_4_ = argv_local._4_4_ + -2;
                x = (t_plot *)&(x->x_obj).te_inlet;
              }
              iVar1 = strcmp(ptVar3->s_name,"-vs");
              if ((iVar1 != 0) || (argv_local._4_4_ < 2)) break;
              fielddesc_setfloatarg((_fielddesc *)(object + 0x3e),1,(t_atom *)&(x->x_obj).te_binbuf)
              ;
              argv_local._4_4_ = argv_local._4_4_ + -2;
              x = (t_plot *)&(x->x_obj).te_inlet;
            }
            iVar1 = strcmp(ptVar3->s_name,"-x");
            if ((iVar1 != 0) || (argv_local._4_4_ < 2)) break;
            fielddesc_setfloatarg((_fielddesc *)(object + 0x2a),1,(t_atom *)&(x->x_obj).te_binbuf);
            argv_local._4_4_ = argv_local._4_4_ + -2;
            x = (t_plot *)&(x->x_obj).te_inlet;
          }
          iVar1 = strcmp(ptVar3->s_name,"-y");
          if ((iVar1 != 0) || (argv_local._4_4_ < 2)) break;
          fielddesc_setfloatarg((_fielddesc *)(object + 0x2f),1,(t_atom *)&(x->x_obj).te_binbuf);
          argv_local._4_4_ = argv_local._4_4_ + -2;
          x = (t_plot *)&(x->x_obj).te_inlet;
        }
        iVar1 = strcmp(ptVar3->s_name,"-w");
        if ((iVar1 != 0) || (argv_local._4_4_ < 2)) break;
        fielddesc_setfloatarg((_fielddesc *)(object + 0x34),1,(t_atom *)&(x->x_obj).te_binbuf);
        argv_local._4_4_ = argv_local._4_4_ + -2;
        x = (t_plot *)&(x->x_obj).te_inlet;
      }
      iVar1 = strcmp(ptVar3->s_name,"-e");
      if ((iVar1 != 0) || (argv_local._4_4_ < 2)) break;
      fielddesc_setfloatarg((_fielddesc *)(object + 0x43),1,(t_atom *)&(x->x_obj).te_binbuf);
      argv_local._4_4_ = argv_local._4_4_ + -2;
      x = (t_plot *)&(x->x_obj).te_inlet;
    }
    if (*ptVar3->s_name != '-') break;
    pd_error(object,"%s: unknown flag \'%s\'...",classsym->s_name,ptVar3->s_name);
    argv_local._4_4_ = argv_local._4_4_ + -1;
    x = (t_plot *)&(x->x_obj).te_binbuf;
  }
  if (argv_local._4_4_ == 0) {
    fielddesc_setfloat_const((_fielddesc *)(object + 0x25),1.0);
  }
  else {
    fielddesc_setarrayarg((_fielddesc *)(object + 0x25),argv_local._4_4_,(t_atom *)x);
    x = (t_plot *)&(x->x_obj).te_binbuf;
    argv_local._4_4_ = argv_local._4_4_ + -1;
  }
  if (argv_local._4_4_ == 0) {
    fielddesc_setfloat_const((_fielddesc *)(object + 7),0.0);
  }
  else {
    fielddesc_setfloatarg((_fielddesc *)(object + 7),argv_local._4_4_,(t_atom *)x);
    x = (t_plot *)&(x->x_obj).te_binbuf;
    argv_local._4_4_ = argv_local._4_4_ + -1;
  }
  if (argv_local._4_4_ == 0) {
    fielddesc_setfloat_const((_fielddesc *)(object + 0xc),1.0);
  }
  else {
    fielddesc_setfloatarg((_fielddesc *)(object + 0xc),argv_local._4_4_,(t_atom *)x);
    x = (t_plot *)&(x->x_obj).te_binbuf;
    argv_local._4_4_ = argv_local._4_4_ + -1;
  }
  if (argv_local._4_4_ == 0) {
    fielddesc_setfloat_const((_fielddesc *)(object + 0x11),1.0);
  }
  else {
    fielddesc_setfloatarg((_fielddesc *)(object + 0x11),argv_local._4_4_,(t_atom *)x);
    x = (t_plot *)&(x->x_obj).te_binbuf;
    argv_local._4_4_ = argv_local._4_4_ + -1;
  }
  if (argv_local._4_4_ == 0) {
    fielddesc_setfloat_const((_fielddesc *)(object + 0x16),1.0);
  }
  else {
    fielddesc_setfloatarg((_fielddesc *)(object + 0x16),argv_local._4_4_,(t_atom *)x);
    x = (t_plot *)&(x->x_obj).te_binbuf;
    argv_local._4_4_ = argv_local._4_4_ + -1;
  }
  if (argv_local._4_4_ == 0) {
    fielddesc_setfloat_const((_fielddesc *)(object + 0x1b),1.0);
  }
  else {
    fielddesc_setfloatarg((_fielddesc *)(object + 0x1b),argv_local._4_4_,(t_atom *)x);
    x = (t_plot *)&(x->x_obj).te_binbuf;
    argv_local._4_4_ = argv_local._4_4_ + -1;
  }
  if (argv_local._4_4_ == 0) {
    fielddesc_setfloat_const((_fielddesc *)(object + 0x20),(float)firstarg._4_4_);
  }
  else {
    fielddesc_setfloatarg((_fielddesc *)(object + 0x20),argv_local._4_4_,(t_atom *)x);
  }
  return object;
}

Assistant:

static void *plot_new(t_symbol *classsym, int argc, t_atom *argv)
{
    t_plot *x = (t_plot *)pd_new(plot_class);
    int defstyle = PLOTSTYLE_POLY;
    x->x_canvas = canvas_getcurrent();

    fielddesc_setfloat_var(&x->x_xpoints, gensym("x"));
    fielddesc_setfloat_var(&x->x_ypoints, gensym("y"));
    fielddesc_setfloat_var(&x->x_wpoints, gensym("w"));

    fielddesc_setfloat_const(&x->x_vis, 1);
    fielddesc_setfloat_const(&x->x_scalarvis, 1);
    fielddesc_setfloat_const(&x->x_edit, 1);
    while (1)
    {
        t_symbol *firstarg = atom_getsymbolarg(0, argc, argv);
        if (!strcmp(firstarg->s_name, "curve") ||
            !strcmp(firstarg->s_name, "-c"))
        {
            defstyle = PLOTSTYLE_BEZ;
            argc--, argv++;
        }
        else if (!strcmp(firstarg->s_name, "-v") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_vis, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-vs") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_scalarvis, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-x") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_xpoints, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-y") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_ypoints, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-w") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_wpoints, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-e") && argc > 1)
        {
            fielddesc_setfloatarg(&x->x_edit, 1, argv+1);
            argc -= 2; argv += 2;
        }
        else if (*firstarg->s_name == '-')
        {
            pd_error(x, "%s: unknown flag '%s'...", classsym->s_name,
                firstarg->s_name);
            argc--; argv++;
        }
        else break;
    }
    if (argc) fielddesc_setarrayarg(&x->x_data, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_data, 1);
    if (argc) fielddesc_setfloatarg(&x->x_outlinecolor, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_outlinecolor, 0);
    if (argc) fielddesc_setfloatarg(&x->x_width, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_width, 1);
    if (argc) fielddesc_setfloatarg(&x->x_xloc, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_xloc, 1);
    if (argc) fielddesc_setfloatarg(&x->x_yloc, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_yloc, 1);
    if (argc) fielddesc_setfloatarg(&x->x_xinc, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_xinc, 1);
    if (argc) fielddesc_setfloatarg(&x->x_style, argc--, argv++);
    else fielddesc_setfloat_const(&x->x_style, defstyle);
    return (x);
}